

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O0

string * perf::format_code_position(string *file,size_t line,string *function)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  ulong uVar3;
  string *in_RCX;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  stringstream strm;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  id in_stack_fffffffffffffe18;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  string *local_20;
  ulong local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,'#');
  std::this_thread::get_id();
  pbVar1 = std::operator<<(in_stack_fffffffffffffe10,in_stack_fffffffffffffe18);
  poVar2 = std::operator<<(pbVar1,':');
  poVar2 = std::operator<<(poVar2,local_10);
  std::operator<<(poVar2,':');
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<(local_198,local_20);
    std::operator<<(poVar2,':');
  }
  std::ostream::operator<<(local_198,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string format_code_position(const std::string &file, std::size_t line, const std::string &function = "")
    {
        std::stringstream strm;
        strm << '#' << std::this_thread::get_id() << ':' << file << ':';
        if (!function.empty())
            strm << function << ':';
        strm << line;
        return strm.str();
    }